

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
dynet::PickRange::dim_forward
          (Dim *__return_storage_ptr__,PickRange *this,
          vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  ulong uVar1;
  uint uVar2;
  pointer pDVar3;
  long lVar4;
  invalid_argument *this_00;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar3 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar3 != 0x24) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes-common.cc"
                  ,0x29f,"virtual Dim dynet::PickRange::dim_forward(const vector<Dim> &) const");
  }
  uVar6 = (ulong)pDVar3->nd;
  if (1 < uVar6) {
    if (pDVar3->d[1] == 1) {
      uVar7 = 1;
      do {
        if ((2 - uVar6) + uVar7 == 1) goto LAB_0039dca3;
        uVar1 = uVar7 + 1;
        lVar4 = uVar7 + 1;
        uVar7 = uVar1;
      } while (pDVar3->d[lVar4] == 1);
      if (uVar6 <= uVar1) goto LAB_0039dca3;
    }
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Bad input dimensions in PickElement: ",0x25);
    operator<<((ostream *)local_190,xs);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_00,local_1b0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_0039dca3:
  uVar2 = this->end;
  if (uVar6 == 0) {
    uVar5 = 1;
  }
  else {
    uVar5 = pDVar3->d[0];
  }
  if (uVar2 <= uVar5) {
    uVar5 = this->start;
    __return_storage_ptr__->bd = pDVar3->bd;
    __return_storage_ptr__->nd = 1;
    __return_storage_ptr__->d[0] = uVar2 - uVar5;
    return __return_storage_ptr__;
  }
  __assert_fail("end <= xs[0][0]",
                "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes-common.cc"
                ,0x2a4,"virtual Dim dynet::PickRange::dim_forward(const vector<Dim> &) const");
}

Assistant:

Dim RandomBernoulli::dim_forward(const vector<Dim>& xs) const {
  return dim;
}